

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

try_update_result_type __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_remove
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_00;
  bool bVar1;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_01;
  atomic<long> *paVar2;
  version_type other;
  bool *pbVar3;
  bool local_347;
  bool local_346;
  byte local_345;
  bool remove_result;
  version_type *local_338;
  node_type *local_330;
  read_critical_section *local_328;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> **local_320;
  value_type local_313;
  _Optional_payload_base<bool> local_312;
  undefined1 local_310 [6];
  optional<bool> opt_remove_result;
  read_critical_section child_critical_section;
  olc_node_ptr child;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piStack_2f0;
  node_type child_type;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *child_in_parent;
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_2e0;
  uint local_2d8;
  byte local_2d1;
  uint shared_prefix_length;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *key_prefix;
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  art_key_type remaining_key;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piStack_2b0;
  tree_depth_type depth;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  basic_node_ptr<unodb::detail::olc_node_header> local_2a0;
  undefined1 local_298 [8];
  leaf_reclaimable_ptr r;
  write_guard node_guard;
  write_guard parent_guard;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  undefined1 auStack_260 [7];
  node_type node_type;
  read_critical_section node_critical_section;
  basic_node_ptr<unodb::detail::olc_node_header> local_248;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  undefined1 local_238 [8];
  read_critical_section parent_critical_section;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  art_key_type k_local;
  bool result_6;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_7;
  bool result_8;
  version_type local_150;
  version_tag_type local_148;
  byte local_139;
  bool result_5;
  version_type local_130;
  version_tag_type local_128;
  byte local_119;
  bool result_2;
  version_type local_110;
  long local_108;
  __int_type_conflict old_value_2;
  long local_f8;
  __int_type_conflict old_value_1;
  long local_e8;
  __int_type_conflict old_value;
  long local_d8;
  memory_order local_d0;
  int local_cc;
  memory_order __b;
  long local_c0;
  memory_order local_b8;
  int local_b4;
  memory_order __b_1;
  long local_a8;
  memory_order local_a0;
  int local_9c;
  memory_order __b_2;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  long local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  atomic<long> *local_60;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  parent_critical_section.version.version = (version_tag_type)this;
  this_local = (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
               k.field_0;
  optimistic_lock::try_read_lock((optimistic_lock *)local_238);
  bVar1 = optimistic_lock::read_critical_section::must_restart((read_critical_section *)local_238);
  if (bVar1) {
    spin_wait_loop_body();
    std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
    node.tagged_ptr._4_4_ = 1;
  }
  else {
    local_248 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                ::load(&this->root);
    bVar1 = optimistic_lock::read_critical_section::check((read_critical_section *)local_238);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                        (&local_248,(nullptr_t)0x0);
      if (bVar1) {
        node_critical_section.version.version._7_1_ = 0;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&k_local.field_0 + 6),
                   (bool *)((long)&node_critical_section.version.version + 7));
        node.tagged_ptr._4_4_ = 1;
      }
      else {
        detail::node_ptr_lock(&local_248);
        optimistic_lock::try_read_lock((optimistic_lock *)auStack_260);
        bVar1 = optimistic_lock::read_critical_section::must_restart
                          ((read_critical_section *)auStack_260);
        if (bVar1) {
          spin_wait_loop_body();
          std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
          node.tagged_ptr._4_4_ = 1;
        }
        else {
          leaf._7_1_ = detail::basic_node_ptr<unodb::detail::olc_node_header>::type(&local_248);
          if (leaf._7_1_ == LEAF) {
            this_01 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                      ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                                (&local_248);
            bVar1 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                              (this_01,(art_key_type)this_local);
            if (bVar1) {
              optimistic_lock::write_guard::write_guard
                        (&node_guard,(read_critical_section *)local_238);
              bVar1 = optimistic_lock::write_guard::must_restart(&node_guard);
              if (bVar1) {
                std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                node.tagged_ptr._4_4_ = 1;
              }
              else {
                optimistic_lock::write_guard::write_guard
                          ((write_guard *)
                           &r._M_t.
                            super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            .
                            super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                           ,(read_critical_section *)auStack_260);
                bVar1 = optimistic_lock::write_guard::must_restart
                                  ((write_guard *)
                                   &r._M_t.
                                    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                    .
                                    super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                                  );
                if (bVar1) {
                  std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                  node.tagged_ptr._4_4_ = 1;
                }
                else {
                  optimistic_lock::write_guard::unlock_and_obsolete
                            ((write_guard *)
                             &r._M_t.
                              super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                              .
                              super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                            );
                  detail::
                  basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
                  ::reclaim_leaf_on_scope_exit
                            ((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
                              *)local_298,this_01,this);
                  detail::basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                            (&local_2a0,(nullptr_t)0x0);
                  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                  ::operator=(&this->root,local_2a0);
                  node_in_parent._7_1_ = 1;
                  std::optional<bool>::optional<bool,_true>
                            ((optional<bool> *)((long)&k_local.field_0 + 6),
                             (bool *)((long)&node_in_parent + 7));
                  node.tagged_ptr._4_4_ = 1;
                  std::
                  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 *)local_298);
                }
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)
                           &r._M_t.
                            super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            .
                            super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                          );
              }
              optimistic_lock::write_guard::~write_guard(&node_guard);
            }
            else {
              paVar2 = (atomic<long> *)(_auStack_260 + 8);
              local_cc = 2;
              ___b = paVar2;
              local_d0 = std::operator&(acquire,__memory_order_mask);
              if (local_cc - 1U < 2) {
                local_d8 = (paVar2->super___atomic_base<long>)._M_i;
              }
              else if (local_cc == 5) {
                local_d8 = (paVar2->super___atomic_base<long>)._M_i;
              }
              else {
                local_d8 = (paVar2->super___atomic_base<long>)._M_i;
              }
              if (local_d8 < 1) {
                __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
              }
              local_8c = 2;
              local_128 = (version_tag_type)
                          optimistic_lock::atomic_version_type::load_relaxed
                                    ((atomic_version_type *)_auStack_260);
              local_119 = optimistic_lock::version_type::operator==
                                    (&local_110,(version_type)local_128);
              if (((local_119 ^ 0xff) & 1) != 0) {
                optimistic_lock::dec_read_lock_count((optimistic_lock *)_auStack_260);
              }
              if ((local_119 & 1) != 0) {
                local_60 = (atomic<long> *)(_auStack_260 + 8);
                local_68 = 1;
                local_6c = 3;
                local_78 = 1;
                LOCK();
                local_e8 = (local_60->super___atomic_base<long>)._M_i;
                (local_60->super___atomic_base<long>)._M_i =
                     (local_60->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                local_80 = local_e8;
                if (local_e8 < 1) {
                  __assert_fail("old_value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
                }
              }
              _auStack_260 = 0;
              if (((local_119 & 1 ^ 0xff) & 1) == 0) {
                node_in_parent._6_1_ = 0;
                std::optional<bool>::optional<bool,_true>
                          ((optional<bool> *)((long)&k_local.field_0 + 6),
                           (bool *)((long)&node_in_parent + 6));
                node.tagged_ptr._4_4_ = 1;
              }
              else {
                std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                node.tagged_ptr._4_4_ = 1;
              }
            }
          }
          else {
            piStack_2b0 = &this->root;
            detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::tree_depth
                      ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                       ((long)&remaining_key.field_0 + 4),0);
            inode = (olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                    )this_local;
            do {
              if (leaf._7_1_ == LEAF) {
                __assert_fail("node_type != node_type::LEAF",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                              ,0x7d6,
                              "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_remove(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                             );
              }
              key_prefix = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                            *)detail::basic_node_ptr<unodb::detail::olc_node_header>::
                              ptr<unodb::detail::olc_inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                                        (&local_248);
              _shared_prefix_length =
                   detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                     *)&key_prefix->f);
              local_2d1 = detail::
                          key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                          ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                    *)&_shared_prefix_length->f);
              local_2e0 = inode;
              local_2d8 = detail::
                          key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                          ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                               *)&_shared_prefix_length->f,
                                              (basic_art_key<unsigned_long>)inode);
              if (local_2d8 < local_2d1) {
                paVar2 = (atomic<long> *)((long)local_238 + 8);
                local_b4 = 2;
                ___b_1 = paVar2;
                local_b8 = std::operator&(acquire,__memory_order_mask);
                if (local_b4 - 1U < 2) {
                  local_c0 = (paVar2->super___atomic_base<long>)._M_i;
                }
                else if (local_b4 == 5) {
                  local_c0 = (paVar2->super___atomic_base<long>)._M_i;
                }
                else {
                  local_c0 = (paVar2->super___atomic_base<long>)._M_i;
                }
                if (local_c0 < 1) {
                  __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                }
                local_88 = 2;
                local_148 = (version_tag_type)
                            optimistic_lock::atomic_version_type::load_relaxed
                                      ((atomic_version_type *)local_238);
                local_139 = optimistic_lock::version_type::operator==
                                      (&local_130,(version_type)local_148);
                if (((local_139 ^ 0xff) & 1) != 0) {
                  optimistic_lock::dec_read_lock_count((optimistic_lock *)local_238);
                }
                if ((local_139 & 1) != 0) {
                  local_38 = (atomic<long> *)((long)local_238 + 8);
                  local_40 = 1;
                  local_44 = 3;
                  local_50 = 1;
                  LOCK();
                  local_f8 = (local_38->super___atomic_base<long>)._M_i;
                  (local_38->super___atomic_base<long>)._M_i =
                       (local_38->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  local_58 = local_f8;
                  if (local_f8 < 1) {
                    __assert_fail("old_value > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const")
                    ;
                  }
                }
                local_238 = (undefined1  [8])0x0;
                if (((local_139 & 1 ^ 0xff) & 1) == 0) {
                  paVar2 = (atomic<long> *)(_auStack_260 + 8);
                  local_9c = 2;
                  ___b_2 = paVar2;
                  local_a0 = std::operator&(acquire,__memory_order_mask);
                  if (local_9c - 1U < 2) {
                    local_a8 = (paVar2->super___atomic_base<long>)._M_i;
                  }
                  else if (local_9c == 5) {
                    local_a8 = (paVar2->super___atomic_base<long>)._M_i;
                  }
                  else {
                    local_a8 = (paVar2->super___atomic_base<long>)._M_i;
                  }
                  if (local_a8 < 1) {
                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                  }
                  local_84 = 2;
                  other = optimistic_lock::atomic_version_type::load_relaxed
                                    ((atomic_version_type *)_auStack_260);
                  bVar1 = optimistic_lock::version_type::operator==(&local_150,other);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    optimistic_lock::dec_read_lock_count((optimistic_lock *)_auStack_260);
                  }
                  if (bVar1) {
                    local_10 = (atomic<long> *)(_auStack_260 + 8);
                    local_18 = 1;
                    local_1c = 3;
                    local_28 = 1;
                    LOCK();
                    local_108 = (local_10->super___atomic_base<long>)._M_i;
                    (local_10->super___atomic_base<long>)._M_i =
                         (local_10->super___atomic_base<long>)._M_i + -1;
                    UNLOCK();
                    local_30 = local_108;
                    if (local_108 < 1) {
                      __assert_fail("old_value > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x343,
                                    "void unodb::optimistic_lock::dec_read_lock_count() const");
                    }
                  }
                  _auStack_260 = 0;
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    child_in_parent._7_1_ = 0;
                    std::optional<bool>::optional<bool,_true>
                              ((optional<bool> *)((long)&k_local.field_0 + 6),
                               (bool *)((long)&child_in_parent + 7));
                    node.tagged_ptr._4_4_ = 1;
                  }
                  else {
                    std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                    node.tagged_ptr._4_4_ = 1;
                  }
                }
                else {
                  std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                  node.tagged_ptr._4_4_ = 1;
                }
                break;
              }
              if (local_2d8 != local_2d1) {
                __assert_fail("shared_prefix_length == key_prefix_length",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                              ,0x7e7,
                              "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_remove(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                             );
              }
              detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::operator+=
                        ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                         ((long)&remaining_key.field_0 + 4),(uint)local_2d1);
              detail::basic_art_key<unsigned_long>::shift_right
                        ((basic_art_key<unsigned_long> *)&inode,(ulong)local_2d1);
              optimistic_lock::read_critical_section::read_critical_section
                        ((read_critical_section *)local_310);
              this_00 = key_prefix;
              local_313 = detail::basic_art_key<unsigned_long>::operator[]
                                    ((basic_art_key<unsigned_long> *)&inode,0);
              local_320 = &stack0xfffffffffffffd10;
              local_330 = (node_type *)((long)&child.tagged_ptr + 7);
              local_338 = &child_critical_section.version;
              local_328 = (read_critical_section *)local_310;
              local_312 = (_Optional_payload_base<bool>)
                          detail::
                          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                          ::
                          remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
                                    ((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                                      *)&this_00->f,leaf._7_1_,&local_313,
                                     (basic_art_key<unsigned_long> *)&this_local,this,
                                     (read_critical_section *)local_238,
                                     (read_critical_section *)auStack_260,&stack0xfffffffffffffd50,
                                     &local_320,&local_328,&local_330,
                                     (basic_node_ptr<unodb::detail::olc_node_header> **)&local_338);
              bVar1 = std::optional::operator_cast_to_bool((optional *)&local_312);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pbVar3 = std::optional<bool>::operator*((optional<bool> *)&local_312);
                local_345 = *pbVar3 & 1;
                if (local_345 == 0) {
                  local_346 = false;
                  std::optional<bool>::optional<bool,_true>
                            ((optional<bool> *)((long)&k_local.field_0 + 6),&local_346);
                  node.tagged_ptr._4_4_ = 1;
                }
                else if (piStack_2f0 ==
                         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                          *)0x0) {
                  local_347 = true;
                  std::optional<bool>::optional<bool,_true>
                            ((optional<bool> *)((long)&k_local.field_0 + 6),&local_347);
                  node.tagged_ptr._4_4_ = 1;
                }
                else {
                  optimistic_lock::read_critical_section::operator=
                            ((read_critical_section *)local_238,(read_critical_section *)auStack_260
                            );
                  local_248.tagged_ptr = child_critical_section.version.version;
                  piStack_2b0 = piStack_2f0;
                  optimistic_lock::read_critical_section::operator=
                            ((read_critical_section *)auStack_260,(read_critical_section *)local_310
                            );
                  leaf._7_1_ = child.tagged_ptr._7_1_;
                  detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::operator++
                            ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                             ((long)&remaining_key.field_0 + 4));
                  detail::basic_art_key<unsigned_long>::shift_right
                            ((basic_art_key<unsigned_long> *)&inode,1);
                  node.tagged_ptr._4_4_ = 0;
                }
              }
              else {
                std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                node.tagged_ptr._4_4_ = 1;
              }
              optimistic_lock::read_critical_section::~read_critical_section
                        ((read_critical_section *)local_310);
            } while (node.tagged_ptr._4_4_ == 0);
          }
        }
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)auStack_260);
      }
    }
    else {
      spin_wait_loop_body();
      std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
      node.tagged_ptr._4_4_ = 1;
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_238)
  ;
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)k_local.field_0.key._6_2_;
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_remove(art_key_type k) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) return false;

  auto node_critical_section = node_ptr_lock(node).try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node_type = node.type();

  if (node_type == node_type::LEAF) {
    auto* const leaf{node.template ptr<leaf_type*>()};
    if (leaf->matches(k)) {
      const optimistic_lock::write_guard parent_guard{
          std::move(parent_critical_section)};
      // Do not call spin_wait_loop_body from this point on - assume
      // the above took enough time
      if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

      optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
      if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

      node_guard.unlock_and_obsolete();

      const auto r{art_policy::reclaim_leaf_on_scope_exit(leaf, *this)};
      root = detail::olc_node_ptr{nullptr};
      return true;
    }

    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE

      return false;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    UNODB_DETAIL_DISABLE_MSVC_WARNING(26494)
    in_critical_section<detail::olc_node_ptr>* child_in_parent;
    enum node_type child_type;
    detail::olc_node_ptr child;
    UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

    optimistic_lock::read_critical_section child_critical_section;

    const auto opt_remove_result{
        inode->template remove_or_choose_subtree<std::optional<bool>>(
            node_type, remaining_key[0], k, *this, parent_critical_section,
            node_critical_section, node_in_parent, &child_in_parent,
            &child_critical_section, &child_type, &child)};

    if (UNODB_DETAIL_UNLIKELY(!opt_remove_result)) return {};

    if (const auto remove_result{*opt_remove_result}; !remove_result)
      return false;

    if (child_in_parent == nullptr) return true;

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    node_critical_section = std::move(child_critical_section);
    node_type = child_type;

    ++depth;
    remaining_key.shift_right(1);
  }
}